

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<double>::SolveEigensystemJacobi
          (TPZMatrix<double> *this,int64_t *numiterations,REAL *tol,TPZVec<double> *Eigenvalues,
          TPZFMatrix<double> *Eigenvectors)

{
  double dVar1;
  double dVar2;
  _func_int **pp_Var3;
  long lVar4;
  bool bVar5;
  int64_t iVar6;
  double *pdVar7;
  TPZVec<double> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  long *in_R8;
  double extraout_XMM0_Qa;
  double dVar8;
  double val;
  int64_t i_9;
  double exp_1;
  int64_t i_8;
  int64_t i_7;
  REAL norm2;
  int64_t i_6;
  double difTemp;
  double dif;
  int64_t count;
  int64_t i_5;
  int64_t i_4;
  REAL norm1;
  int64_t i_3;
  int64_t i_2;
  double exp;
  double answ;
  TPZFNMatrix<9,_double> Matrix_1;
  int64_t i_1;
  int64_t eigen;
  TPZFNMatrix<3,_double> VecIni_cp;
  TPZFNMatrix<3,_double> VecIni;
  bool result;
  int64_t j;
  int64_t i;
  TPZFNMatrix<9,_double> Matrix;
  int64_t size;
  REAL tolerance;
  int64_t NumIt;
  TPZFMatrix<double> *in_stack_fffffffffffff9d8;
  TPZMatrix<double> *in_stack_fffffffffffff9e0;
  double *in_stack_fffffffffffff9e8;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffff9f0;
  TPZFMatrix<double> *in_stack_fffffffffffff9f8;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffa00;
  int64_t in_stack_fffffffffffffa08;
  TPZFNMatrix<3,_double> *in_stack_fffffffffffffa10;
  double *in_stack_fffffffffffffa20;
  TPZVec<double> *in_stack_fffffffffffffa28;
  TPZFMatrix<double> *in_stack_fffffffffffffa30;
  _func_int **local_4e0;
  long local_4d8;
  long local_4c8;
  long local_4c0;
  double local_4b8;
  long local_4b0;
  double local_4a8;
  double local_4a0;
  long local_498;
  long local_490;
  long local_488;
  double local_480;
  long local_470;
  TPZVec<double> *in_stack_fffffffffffffba0;
  long lVar9;
  REAL *in_stack_fffffffffffffba8;
  int64_t *in_stack_fffffffffffffbb0;
  TPZMatrix<double> *in_stack_fffffffffffffbb8;
  long local_2d0;
  long local_2c8;
  long local_138;
  long local_130;
  bool local_1;
  
  lVar4 = *in_RSI;
  dVar1 = *in_RDX;
  iVar6 = TPZBaseMatrix::Rows(in_RDI);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
             (int64_t)in_stack_fffffffffffff9e0);
  for (local_130 = 0; local_130 < iVar6; local_130 = local_130 + 1) {
    for (local_138 = 0; local_138 < iVar6; local_138 = local_138 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_130,local_138);
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
      *pdVar7 = extraout_XMM0_Qa;
    }
  }
  bVar5 = SolveEigenvaluesJacobi
                    (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                     in_stack_fffffffffffffba0);
  if (bVar5) {
    TPZFNMatrix<3,_double>::TPZFNMatrix
              (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
               (int64_t)in_stack_fffffffffffffa00,(double *)in_stack_fffffffffffff9f8);
    TPZFNMatrix<3,_double>::TPZFNMatrix
              (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
               (int64_t)in_stack_fffffffffffffa00,(double *)in_stack_fffffffffffff9f8);
    (**(code **)(*in_R8 + 0x68))(in_R8,iVar6);
    (**(code **)(*in_R8 + 0x78))();
    for (local_2c8 = 0; local_2c8 < iVar6; local_2c8 = local_2c8 + 1) {
      for (local_2d0 = 0; local_2d0 < iVar6; local_2d0 = local_2d0 + 1) {
        rand();
        TPZFMatrix<double>::PutVal
                  (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                   (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0,
                   (double *)in_stack_fffffffffffff9d8);
      }
      TPZFMatrix<double>::TPZFMatrix
                (in_stack_fffffffffffffa30,(TPZMatrix<double> *)in_stack_fffffffffffffa28);
      TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12defb3);
      TPZVec<double>::operator[](in_RCX,local_2c8);
      dVar8 = ReturnNearestValue((double)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                                 (double)in_stack_fffffffffffffa20);
      pdVar7 = TPZVec<double>::operator[](in_RCX,local_2c8);
      if (ABS(dVar8 - *pdVar7) <= 1e-05) {
        for (local_470 = 0; local_470 < iVar6; local_470 = local_470 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_470);
          TPZVec<double>::operator[](in_RCX,local_2c8);
          TPZFMatrix<double>::PutVal
                    (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                     (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0,
                     (double *)in_stack_fffffffffffff9d8);
        }
      }
      else {
        for (lVar9 = 0; lVar9 < iVar6; lVar9 = lVar9 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,lVar9);
          TPZVec<double>::operator[](in_RCX,local_2c8);
          TPZFMatrix<double>::PutVal
                    (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                     (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0,
                     (double *)in_stack_fffffffffffff9d8);
        }
      }
      local_480 = 0.0;
      for (local_488 = 0; local_488 < iVar6; local_488 = local_488 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
        dVar8 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
        local_480 = ABS(dVar8) * ABS(*pdVar7) + local_480;
      }
      dVar8 = sqrt(local_480);
      for (local_490 = 0; local_490 < iVar6; local_490 = local_490 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
        dVar2 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
        *pdVar7 = dVar2 / dVar8;
      }
      local_4a0 = 10.0;
      for (local_498 = 0; dVar1 < local_4a0 && local_498 <= lVar4; local_498 = local_498 + 1) {
        for (local_4b0 = 0; local_4b0 < iVar6; local_4b0 = local_4b0 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0)
          ;
          dVar8 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0)
          ;
          *pdVar7 = dVar8;
        }
        Solve_LU(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        local_4b8 = 0.0;
        for (local_4c0 = 0; local_4c0 < iVar6; local_4c0 = local_4c0 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0)
          ;
          in_stack_fffffffffffffa30 = (TPZFMatrix<double> *)((ulong)*pdVar7 & 0x7fffffffffffffff);
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0)
          ;
          local_4b8 = (double)in_stack_fffffffffffffa30 * ABS(*pdVar7) + local_4b8;
        }
        dVar8 = sqrt(local_4b8);
        local_4a8 = 0.0;
        for (local_4c8 = 0; local_4c8 < iVar6; local_4c8 = local_4c8 + 1) {
          in_stack_fffffffffffffa28 =
               (TPZVec<double> *)
               TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
          pp_Var3 = (((TPZBaseMatrix *)&in_stack_fffffffffffffa28->_vptr_TPZVec)->super_TPZSavable).
                    _vptr_TPZSavable;
          in_stack_fffffffffffffa20 =
               TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
          *in_stack_fffffffffffffa20 = (double)pp_Var3 / dVar8;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0)
          ;
          in_stack_fffffffffffffa00 = (TPZFNMatrix<9,_double> *)*pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0)
          ;
          in_stack_fffffffffffff9f0 =
               (TPZFNMatrix<9,_double> *)((double)in_stack_fffffffffffffa00 - *pdVar7);
          in_stack_fffffffffffff9f8 =
               (TPZFMatrix<double> *)
               TPZFMatrix<double>::operator()
                         ((TPZFMatrix<double> *)in_stack_fffffffffffff9f0,
                          (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
          in_stack_fffffffffffff9e0 =
               (TPZMatrix<double> *)
               (in_stack_fffffffffffff9f8->super_TPZMatrix<double>).super_TPZBaseMatrix.
               super_TPZSavable._vptr_TPZSavable;
          in_stack_fffffffffffff9e8 =
               TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
          local_4a8 = ABS((double)in_stack_fffffffffffff9f0 *
                          ((double)in_stack_fffffffffffff9e0 - *in_stack_fffffffffffff9e8)) +
                      local_4a8;
        }
        local_4a0 = sqrt(local_4a8);
      }
      for (local_4d8 = 0; local_4d8 < iVar6; local_4d8 = local_4d8 + 1) {
        in_stack_fffffffffffff9d8 =
             (TPZFMatrix<double> *)
             TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
        local_4e0 = (in_stack_fffffffffffff9d8->super_TPZMatrix<double>).super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable;
        if (ABS((double)local_4e0) < 1e-05) {
          local_4e0 = (_func_int **)0x0;
        }
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff9f0->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff9e8,(int64_t)in_stack_fffffffffffff9e0);
        *pdVar7 = (double)local_4e0;
      }
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x12df969);
    }
    local_1 = true;
    TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x12df9a2);
    TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x12df9af);
  }
  else {
    local_1 = false;
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x12df9da);
  return local_1;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}